

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InterfacePortSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InterfacePortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1)

{
  string_view name;
  InterfacePortSymbol *pIVar1;
  InterfacePortSymbol *in_RDX;
  SourceLocation in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pIVar1 = (InterfacePortSymbol *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  name._M_str = unaff_retaddr;
  name._M_len = in_RDI;
  ast::InterfacePortSymbol::InterfacePortSymbol(in_RDX,name,in_RSI);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }